

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::run(Highs *this)

{
  size_type sVar1;
  Highs *in_RDI;
  HighsInt num_linear_objective;
  Highs *in_stack_000002b0;
  Highs *in_stack_00000718;
  Highs *in_stack_000013e8;
  HighsStatus local_4;
  
  if (((in_RDI->options_).super_HighsOptionsStruct.use_warm_start & 1U) == 0) {
    clearSolver(in_RDI);
  }
  reportModelStats(in_stack_000002b0);
  sVar1 = std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::size
                    (&in_RDI->multi_linear_objective_);
  if ((int)sVar1 == 0) {
    local_4 = solve(in_stack_000013e8);
  }
  else {
    local_4 = multiobjectiveSolve(in_stack_00000718);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::run() {
  if (!options_.use_warm_start) this->clearSolver();
  this->reportModelStats();
  HighsInt num_linear_objective = this->multi_linear_objective_.size();
  if (num_linear_objective == 0) return this->solve();
  return this->multiobjectiveSolve();
}